

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrohnerBackgroundRMatrix.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix::
print<std::back_insert_iterator<std::__cxx11::string>>
          (FrohnerBackgroundRMatrix *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  initializer_list<double> __l;
  allocator_type local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  double local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined1 local_78 [48];
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_78._24_8_ = SEXT48(*(int *)this);
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 3;
  local_78._32_16_ = ZEXT816(0);
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_78,it,MAT,MF,MT);
  local_98 = *(double *)(this + 0x18);
  uStack_90 = *(undefined8 *)(this + 0x20);
  local_88 = *(undefined8 *)(this + 0x28);
  local_c8 = *(undefined8 *)(this + 8);
  uStack_c0 = *(undefined8 *)(this + 0x10);
  __l._M_len = 3;
  __l._M_array = &local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b8,__l,&local_c9);
  local_78._8_8_ =
       (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 3;
  local_78._0_8_ = 0;
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  local_78._40_4_ = (int)local_c8;
  local_78._32_8_ = uStack_c0;
  local_78._44_4_ = (int)((ulong)local_c8 >> 0x20);
  local_48._M_impl.super__Vector_impl_data._M_start =
       local_b8._M_impl.super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       local_b8._M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ListRecord *)local_78,it,MAT,MF,MT);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

    ControlRecord( 0.0, 0.0, this->LCH(),
                   this->LBK(), 0, 0 ).print( it, MAT, MF, MT );
    ListRecord( this->ED(), this->EU(), 0 ,0, 0,
                { this->R0(), this->S0(),
                  this->GA() } ).print( it, MAT, MF, MT );
  }